

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::SepBy1BasicType<tinyusdz::value::point3h>
          (AsciiParser *this,char sep,char end_symbol,
          vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_> *result)

{
  pointer ppVar1;
  StreamReader *pSVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  point3h *ppVar6;
  char *pcVar7;
  point3h value;
  allocator local_51;
  point3h value_1;
  
  ppVar6 = &value;
  ppVar1 = (result->
           super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if ((result->
      super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>).
      _M_impl.super__Vector_impl_data._M_finish != ppVar1) {
    (result->super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>
    )._M_impl.super__Vector_impl_data._M_finish = ppVar1;
  }
  bVar3 = SkipWhitespaceAndNewline(this,true);
  if (bVar3) {
    bVar3 = ReadBasicType(this,&value);
    if (bVar3) {
      ::std::vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>::push_back
                (result,&value);
      do {
        bVar3 = Eof(this);
        if (bVar3) goto LAB_002c2291;
        bVar3 = SkipCommentAndWhitespaceAndNewline(this,true);
        if (!bVar3) {
          return false;
        }
        bVar3 = Char1(this,(char *)&value);
        if (!bVar3) {
          return false;
        }
        if ((char)value.x.value == sep) {
          bVar3 = SkipCommentAndWhitespaceAndNewline(this,true);
          if (!bVar3) {
            return false;
          }
          bVar3 = LookChar1(this,(char *)&value_1);
          if (!bVar3) {
            return false;
          }
          iVar4 = 3;
          if ((char)value_1.x.value != end_symbol) goto LAB_002c21f9;
        }
        else {
LAB_002c21f9:
          if ((char)value.x.value != sep) {
            pSVar2 = this->_sr;
            if ((0 < (long)pSVar2->idx_) && (uVar5 = pSVar2->idx_ - 1, uVar5 <= pSVar2->length_)) {
              pSVar2->idx_ = uVar5;
            }
            goto LAB_002c2291;
          }
          bVar3 = SkipWhitespaceAndNewline(this,true);
          if (!bVar3) {
            return false;
          }
          bVar3 = ReadBasicType(this,&value_1);
          iVar4 = 3;
          if (bVar3) {
            ::std::vector<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>::
            push_back(result,&value_1);
            iVar4 = 0;
          }
        }
      } while (iVar4 == 0);
      if (iVar4 == 1) {
        return false;
      }
LAB_002c2291:
      if ((result->
          super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>).
          _M_impl.super__Vector_impl_data._M_start !=
          (result->
          super__Vector_base<tinyusdz::value::point3h,_std::allocator<tinyusdz::value::point3h>_>).
          _M_impl.super__Vector_impl_data._M_finish) {
        return true;
      }
      pcVar7 = "Empty array.\n";
    }
    else {
      pcVar7 = "Not starting with the value of requested type.\n";
      ppVar6 = (point3h *)&local_51;
    }
    ::std::__cxx11::string::string((string *)&value_1,pcVar7,(allocator *)ppVar6);
    PushError(this,(string *)&value_1);
    ::std::__cxx11::string::_M_dispose();
  }
  return false;
}

Assistant:

bool AsciiParser::SepBy1BasicType(const char sep, const char end_symbol, std::vector<T> *result) {
  result->clear();

  if (!SkipWhitespaceAndNewline()) {
    return false;
  }

  {
    T value;
    if (!ReadBasicType(&value)) {
      PushError("Not starting with the value of requested type.\n");
      return false;
    }

    result->push_back(value);
  }

  while (!Eof()) {
    if (!SkipCommentAndWhitespaceAndNewline()) {
      return false;
    }

    // sep
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == sep) {
      // Look next token
      if (!SkipCommentAndWhitespaceAndNewline()) {
        return false;
      }

      char nc;
      if (!LookChar1(&nc)) {
        return false;
      }

      if (nc == end_symbol) {
        // end
        break;
      }
    }

    if (c != sep) {
      // end
      _sr->seek_from_current(-1);  // unwind single char
      break;
    }

    if (!SkipWhitespaceAndNewline()) {
      return false;
    }

    T value;
    if (!ReadBasicType(&value)) {
      break;
    }

    result->push_back(value);


  }

  if (result->empty()) {
    PushError("Empty array.\n");
    return false;
  }

  return true;
}